

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O1

void duckdb_aggregate_function_set_destructor
               (duckdb_aggregate_function function,duckdb_aggregate_destroy_t destroy)

{
  AggregateFunctionInfo *pAVar1;
  
  if (destroy != (duckdb_aggregate_destroy_t)0x0 && function != (duckdb_aggregate_function)0x0) {
    pAVar1 = duckdb::shared_ptr<duckdb::AggregateFunctionInfo,_true>::operator->
                       ((shared_ptr<duckdb::AggregateFunctionInfo,_true> *)(function + 0x120));
    pAVar1[6]._vptr_AggregateFunctionInfo = (_func_int **)destroy;
    *(code **)(function + 0xf8) = duckdb::CAPIAggregateDestructor;
  }
  return;
}

Assistant:

void duckdb_aggregate_function_set_destructor(duckdb_aggregate_function function, duckdb_aggregate_destroy_t destroy) {
	if (!function || !destroy) {
		return;
	}
	auto &aggregate_function = GetCAggregateFunction(function);
	auto &function_info = aggregate_function.function_info->Cast<duckdb::CAggregateFunctionInfo>();
	function_info.destroy = destroy;
	aggregate_function.destructor = duckdb::CAPIAggregateDestructor;
}